

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vending_machine.hpp
# Opt level: O0

void __thiscall vending::vending_def::add_goods(vending_def *this,load_goods *entry)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  vending_fsm *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_vending::goods_entry>_>,_bool> pVar4;
  load_done local_41;
  _Base_ptr local_40;
  undefined1 local_38;
  goods_entry local_30;
  _Self local_28;
  _Self local_20;
  iterator f;
  load_goods *entry_local;
  vending_def *this_local;
  
  f._M_node = (_Base_ptr)entry;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_vending::goods_entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_vending::goods_entry>_>_>
       ::find(&this->goods,&entry->p_no);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_vending::goods_entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_vending::goods_entry>_>_>
       ::end(&this->goods);
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    local_30.amount = *(int *)&(f._M_node)->_M_parent;
    local_30.price = 0.0;
    pVar4 = std::
            map<unsigned_long,vending::goods_entry,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
            ::emplace<unsigned_long&,vending::goods_entry>
                      ((map<unsigned_long,vending::goods_entry,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
                        *)&this->goods,(unsigned_long *)f._M_node,&local_30);
    local_40 = (_Base_ptr)pVar4.first._M_node;
    local_38 = pVar4.second;
  }
  else {
    iVar1 = *(int *)&(f._M_node)->_M_parent;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_vending::goods_entry>_>::
             operator->(&local_20);
    (ppVar3->second).amount = iVar1 + (ppVar3->second).amount;
  }
  this_00 = rebind(this);
  afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::process_event<vending::events::load_done>(this_00,&local_41);
  return;
}

Assistant:

void
    add_goods(events::load_goods&& entry)
    {
        auto f = goods.find(entry.p_no);
        if (f == goods.end()) {
            goods.emplace(entry.p_no, goods_entry{entry.amount, 0});
        } else {
            f->second.amount += entry.amount;
        }
        rebind().process_event(events::load_done{});
    }